

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O0

int Cudd_ReadIthClause(DdTlcInfo *tlc,int i,DdHalfWord *var1,DdHalfWord *var2,int *phase1,
                      int *phase2)

{
  short sVar1;
  int *phase2_local;
  int *phase1_local;
  DdHalfWord *var2_local;
  DdHalfWord *var1_local;
  int i_local;
  DdTlcInfo *tlc_local;
  
  if (tlc == (DdTlcInfo *)0x0) {
    tlc_local._4_4_ = 0;
  }
  else if ((tlc->vars == (DdHalfWord *)0x0) || (tlc->phases == (long *)0x0)) {
    tlc_local._4_4_ = 0;
  }
  else if ((i < 0) || (tlc->cnt <= (uint)i)) {
    tlc_local._4_4_ = 0;
  }
  else {
    *var1 = tlc->vars[i << 1];
    *var2 = tlc->vars[i * 2 + 1];
    sVar1 = bitVectorRead(tlc->phases,i << 1);
    *phase1 = (int)sVar1;
    sVar1 = bitVectorRead(tlc->phases,i * 2 + 1);
    *phase2 = (int)sVar1;
    tlc_local._4_4_ = 1;
  }
  return tlc_local._4_4_;
}

Assistant:

int
Cudd_ReadIthClause(
  DdTlcInfo * tlc,
  int i,
  DdHalfWord *var1,
  DdHalfWord *var2,
  int *phase1,
  int *phase2)
{
    if (tlc == NULL) return(0);
    if (tlc->vars == NULL || tlc->phases == NULL) return(0);
    if (i < 0 || (unsigned) i >= tlc->cnt) return(0);
    *var1 = tlc->vars[2*i];
    *var2 = tlc->vars[2*i+1];
    *phase1 = (int) bitVectorRead(tlc->phases, 2*i);
    *phase2 = (int) bitVectorRead(tlc->phases, 2*i+1);
    return(1);

}